

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPrimalHeuristics.cpp
# Opt level: O3

void __thiscall HighsPrimalHeuristics::rootReducedCost(HighsPrimalHeuristics *this)

{
  undefined4 uVar1;
  undefined4 uVar3;
  HighsMipSolver *pHVar2;
  HighsLp *lp;
  undefined1 auVar4 [16];
  _Head_base<0UL,_HighsMipSolverData_*,_false> _Var5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  pointer ppVar9;
  double dVar10;
  double dVar11;
  double to_lower_bound;
  HighsDomainChange boundchg;
  double local_410;
  vector<std::pair<double,_HighsDomainChange>,_std::allocator<std::pair<double,_HighsDomainChange>_>_>
  lurkingBounds;
  vector<double,_std::allocator<double>_> local_3e8;
  vector<double,_std::allocator<double>_> local_3d0;
  HeuristicNeighbourhood neighbourhood;
  HighsDomain localdom;
  
  HighsRedcostFixing::getLurkingBounds
            (&lurkingBounds,
             &((this->mipsolver->mipdata_)._M_t.
               super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
               _M_t.
               super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
               .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->redcostfixing,
             this->mipsolver);
  lVar6 = (long)lurkingBounds.
                super__Vector_base<std::pair<double,_HighsDomainChange>,_std::allocator<std::pair<double,_HighsDomainChange>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)lurkingBounds.
                super__Vector_base<std::pair<double,_HighsDomainChange>,_std::allocator<std::pair<double,_HighsDomainChange>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 3;
  _Var5._M_head_impl =
       (this->mipsolver->mipdata_)._M_t.
       super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
       super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
       super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
  if ((ulong)((long)*(pointer *)((long)&(_Var5._M_head_impl)->integral_cols + 8) -
              *(long *)&((_Var5._M_head_impl)->integral_cols).
                        super__Vector_base<int,_std::allocator<int>_> >> 2) <=
      (ulong)(lVar6 * -0x5555555555555552)) {
    if (lurkingBounds.
        super__Vector_base<std::pair<double,_HighsDomainChange>,_std::allocator<std::pair<double,_HighsDomainChange>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        lurkingBounds.
        super__Vector_base<std::pair<double,_HighsDomainChange>,_std::allocator<std::pair<double,_HighsDomainChange>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      uVar7 = lVar6 * -0x5555555555555555;
      iVar8 = 0;
      if (1 < uVar7) {
        iVar8 = 0;
        do {
          uVar7 = (long)uVar7 >> 1;
          iVar8 = iVar8 + 1;
        } while (1 < uVar7);
      }
      pdqsort_detail::
      pdqsort_loop<__gnu_cxx::__normal_iterator<std::pair<double,HighsDomainChange>*,std::vector<std::pair<double,HighsDomainChange>,std::allocator<std::pair<double,HighsDomainChange>>>>,HighsPrimalHeuristics::rootReducedCost()::__0,false>
                (lurkingBounds.
                 super__Vector_base<std::pair<double,_HighsDomainChange>,_std::allocator<std::pair<double,_HighsDomainChange>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 lurkingBounds.
                 super__Vector_base<std::pair<double,_HighsDomainChange>,_std::allocator<std::pair<double,_HighsDomainChange>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,iVar8,1);
      _Var5._M_head_impl =
           (this->mipsolver->mipdata_)._M_t.
           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
           super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
    }
    HighsDomain::HighsDomain(&localdom,&(_Var5._M_head_impl)->domain);
    HeuristicNeighbourhood::HeuristicNeighbourhood(&neighbourhood,this->mipsolver,&localdom);
    if (lurkingBounds.
        super__Vector_base<std::pair<double,_HighsDomainChange>,_std::allocator<std::pair<double,_HighsDomainChange>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        lurkingBounds.
        super__Vector_base<std::pair<double,_HighsDomainChange>,_std::allocator<std::pair<double,_HighsDomainChange>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      _Var5._M_head_impl =
           (this->mipsolver->mipdata_)._M_t.
           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
           super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
      dVar10 = (_Var5._M_head_impl)->lower_bound + (_Var5._M_head_impl)->feastol;
      local_410 = (lurkingBounds.
                   super__Vector_base<std::pair<double,_HighsDomainChange>,_std::allocator<std::pair<double,_HighsDomainChange>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->first;
      if (dVar10 < local_410) {
        ppVar9 = lurkingBounds.
                 super__Vector_base<std::pair<double,_HighsDomainChange>,_std::allocator<std::pair<double,_HighsDomainChange>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        do {
          dVar11 = (ppVar9->second).boundval;
          iVar8 = (ppVar9->second).column;
          if ((ppVar9->second).boundtype == kLower) {
            if (localdom.col_lower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[iVar8] < dVar11) goto LAB_002d311b;
          }
          else if (dVar11 < localdom.col_upper_.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start[iVar8]) {
LAB_002d311b:
            uVar1 = (ppVar9->second).column;
            uVar3 = (ppVar9->second).boundtype;
            boundchg.boundtype = uVar3;
            boundchg.column = uVar1;
            boundchg.boundval = dVar11;
            HighsDomain::changeBound(&localdom,boundchg,(Reason)0xffffffff);
            while (HighsDomain::propagate(&localdom), localdom.infeasible_ == true) {
              HighsDomain::conflictAnalysis
                        (&localdom,
                         &((this->mipsolver->mipdata_)._M_t.
                           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                           .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->
                          conflictPool);
              pHVar2 = this->mipsolver;
              _Var5._M_head_impl =
                   (pHVar2->mipdata_)._M_t.
                   super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                   .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
              dVar11 = (_Var5._M_head_impl)->lower_bound;
              to_lower_bound = local_410;
              if (local_410 <= dVar11) {
                to_lower_bound = dVar11;
              }
              (_Var5._M_head_impl)->lower_bound = to_lower_bound;
              if (pHVar2->submip == false) {
                if ((to_lower_bound != dVar11) || (NAN(to_lower_bound) || NAN(dVar11))) {
                  HighsMipSolverData::updatePrimalDualIntegral
                            (_Var5._M_head_impl,dVar11,to_lower_bound,
                             (_Var5._M_head_impl)->upper_bound,(_Var5._M_head_impl)->upper_bound,
                             true,true);
                }
              }
              HighsDomain::backtrack(&localdom);
              if ((int)((ulong)((long)localdom.branchPos_.
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_finish -
                               (long)localdom.branchPos_.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start) >> 2) == 0) break;
              neighbourhood.nCheckedChanges = neighbourhood.startCheckedChanges;
              if (neighbourhood.fixedCols.numElements != 0) {
                HighsHashTable<int,_void>::clear(&neighbourhood.fixedCols);
              }
            }
            dVar11 = HeuristicNeighbourhood::getFixingRate(&neighbourhood);
            if (0.5 <= dVar11) break;
          }
          ppVar9 = ppVar9 + 1;
          if ((ppVar9 == lurkingBounds.
                         super__Vector_base<std::pair<double,_HighsDomainChange>,_std::allocator<std::pair<double,_HighsDomainChange>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish) ||
             (local_410 = ppVar9->first, local_410 <= dVar10)) break;
        } while( true );
      }
    }
    dVar10 = HeuristicNeighbourhood::getFixingRate(&neighbourhood);
    if (0.3 <= dVar10) {
      lp = this->mipsolver->model_;
      _Var5._M_head_impl =
           (this->mipsolver->mipdata_)._M_t.
           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
           super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
      std::vector<double,_std::allocator<double>_>::vector(&local_3d0,&localdom.col_lower_);
      std::vector<double,_std::allocator<double>_>::vector(&local_3e8,&localdom.col_upper_);
      auVar4 = SEXT816(0x6666666666666667) *
               SEXT816(((this->mipsolver->mipdata_)._M_t.
                        super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                        .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->num_nodes
                      );
      solveSubMip(this,lp,&(_Var5._M_head_impl)->firstrootbasis,dVar10,&local_3d0,&local_3e8,500,
                  ((int)(auVar4._8_8_ >> 3) - (auVar4._12_4_ >> 0x1f)) + 200,0xc);
      if (local_3e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_3e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_3d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_3d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
    HighsHashTable<int,_void>::~HighsHashTable(&neighbourhood.fixedCols);
    HighsDomain::~HighsDomain(&localdom);
  }
  if (lurkingBounds.
      super__Vector_base<std::pair<double,_HighsDomainChange>,_std::allocator<std::pair<double,_HighsDomainChange>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(lurkingBounds.
                    super__Vector_base<std::pair<double,_HighsDomainChange>,_std::allocator<std::pair<double,_HighsDomainChange>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void HighsPrimalHeuristics::rootReducedCost() {
  std::vector<std::pair<double, HighsDomainChange>> lurkingBounds =
      mipsolver.mipdata_->redcostfixing.getLurkingBounds(mipsolver);
  if (10 * lurkingBounds.size() < mipsolver.mipdata_->integral_cols.size())
    return;
  pdqsort(lurkingBounds.begin(), lurkingBounds.end(),
          [](const std::pair<double, HighsDomainChange>& a,
             const std::pair<double, HighsDomainChange>& b) {
            return a.first > b.first;
          });

  auto localdom = mipsolver.mipdata_->domain;

  HeuristicNeighbourhood neighbourhood(mipsolver, localdom);

  double currCutoff = kHighsInf;
  double lower_bound;

  lower_bound = mipsolver.mipdata_->lower_bound + mipsolver.mipdata_->feastol;

  for (const std::pair<double, HighsDomainChange>& domchg : lurkingBounds) {
    currCutoff = domchg.first;

    if (currCutoff <= lower_bound) break;

    if (localdom.isActive(domchg.second)) continue;
    localdom.changeBound(domchg.second);

    while (true) {
      localdom.propagate();
      if (localdom.infeasible()) {
        localdom.conflictAnalysis(mipsolver.mipdata_->conflictPool);

        double prev_lower_bound = mipsolver.mipdata_->lower_bound;

        mipsolver.mipdata_->lower_bound =
            std::max(mipsolver.mipdata_->lower_bound, currCutoff);

        const bool bound_change =
            mipsolver.mipdata_->lower_bound != prev_lower_bound;
        if (!mipsolver.submip && bound_change)
          mipsolver.mipdata_->updatePrimalDualIntegral(
              prev_lower_bound, mipsolver.mipdata_->lower_bound,
              mipsolver.mipdata_->upper_bound, mipsolver.mipdata_->upper_bound);
        localdom.backtrack();
        if (localdom.getBranchDepth() == 0) break;
        neighbourhood.backtracked();
        continue;
      }
      break;
    }
    double fixingRate = neighbourhood.getFixingRate();
    if (fixingRate >= 0.5) break;
    // double gap = (currCutoff - mipsolver.mipdata_->lower_bound) /
    //             std::max(std::abs(mipsolver.mipdata_->lower_bound), 1.0);
    // if (gap < 0.001) break;
  }

  double fixingRate = neighbourhood.getFixingRate();
  if (fixingRate < 0.3) return;

  solveSubMip(*mipsolver.model_, mipsolver.mipdata_->firstrootbasis, fixingRate,
              localdom.col_lower_, localdom.col_upper_,
              500,  // std::max(50, int(0.05 *
                    // (mipsolver.mipdata_->num_leaves))),
              200 + mipsolver.mipdata_->num_nodes / 20, 12);
}